

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-rasterize.c
# Opt level: O2

void plutovg_span_buffer_copy(plutovg_span_buffer_t *span_buffer,plutovg_span_buffer_t *source)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  plutovg_span_t *ppVar7;
  int iVar8;
  plutovg_span_t *__src;
  long lVar9;
  
  (span_buffer->spans).size = 0;
  __src = (source->spans).data;
  if ((__src != (plutovg_span_t *)0x0) && (iVar8 = (source->spans).size, 0 < iVar8)) {
    uVar2 = (span_buffer->spans).capacity;
    if ((int)uVar2 < iVar8) {
      uVar5 = 8;
      if (uVar2 != 0) {
        uVar5 = (ulong)uVar2;
      }
      do {
        uVar6 = uVar5;
        iVar3 = (int)uVar6;
        uVar5 = (ulong)(uint)(iVar3 * 2);
      } while (iVar3 < iVar8);
      ppVar7 = (plutovg_span_t *)realloc((span_buffer->spans).data,uVar6 << 4);
      (span_buffer->spans).data = ppVar7;
      (span_buffer->spans).capacity = iVar3;
      lVar9 = (long)(span_buffer->spans).size;
      __src = (source->spans).data;
      iVar8 = (source->spans).size;
    }
    else {
      ppVar7 = (span_buffer->spans).data;
      lVar9 = 0;
    }
    memcpy(ppVar7 + lVar9,__src,(long)iVar8 << 4);
    piVar1 = &(span_buffer->spans).size;
    *piVar1 = *piVar1 + (source->spans).size;
  }
  iVar8 = source->y;
  iVar3 = source->w;
  iVar4 = source->h;
  span_buffer->x = source->x;
  span_buffer->y = iVar8;
  span_buffer->w = iVar3;
  span_buffer->h = iVar4;
  return;
}

Assistant:

void plutovg_span_buffer_copy(plutovg_span_buffer_t* span_buffer, const plutovg_span_buffer_t* source)
{
    plutovg_array_clear(span_buffer->spans);
    plutovg_array_append(span_buffer->spans, source->spans);
    span_buffer->x = source->x;
    span_buffer->y = source->y;
    span_buffer->w = source->w;
    span_buffer->h = source->h;
}